

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::exitPhase1ResetDuals(HEkkDual *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  HighsLogOptions *log_options_;
  int *piVar11;
  long in_RDI;
  double shift;
  HighsInt iRow;
  double lp_upper;
  double lp_lower;
  HighsInt iVar;
  double sum_shift;
  HighsInt num_shift;
  HighsInt numTot;
  HighsSimplexInfo *info;
  SimplexBasis *basis;
  HighsLp *lp;
  HighsInt in_stack_00000068;
  SimplexAlgorithm in_stack_0000006c;
  HEkk *in_stack_00000070;
  HEkk *in_stack_00000180;
  double local_48;
  double local_40;
  uint local_34;
  HighsLogOptions *local_30;
  uint local_28;
  
  lVar5 = *(long *)(in_RDI + 0x10);
  piVar11 = (int *)(lVar5 + 0x2198);
  lVar6 = *(long *)(in_RDI + 0x10);
  lVar7 = *(long *)(in_RDI + 0x10);
  if ((*(byte *)(lVar7 + 0x28d5) & 1) == 0) {
    highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kDetailed,
                "Re-perturbing costs when optimal in phase 1\n");
    HEkk::initialiseCost(in_stack_00000070,in_stack_0000006c,in_stack_00000068,this._7_1_);
    HEkk::computeDual(in_stack_00000180);
  }
  else {
    highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kInfo,
                "Costs are already perturbed in exitPhase1ResetDuals\n");
  }
  iVar2 = *piVar11;
  iVar3 = *(int *)(lVar5 + 0x219c);
  local_28 = 0;
  local_30 = (HighsLogOptions *)0x0;
  for (local_34 = 0; (int)local_34 < iVar2 + iVar3; local_34 = local_34 + 1) {
    pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(lVar6 + 0x2990),
                        (long)(int)local_34);
    if (*pvVar8 != '\0') {
      if ((int)local_34 < *piVar11) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x21b8),
                            (long)(int)local_34);
        local_40 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x21d0),
                            (long)(int)local_34);
        local_48 = *pvVar9;
      }
      else {
        iVar4 = *piVar11;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x21e8),
                            (long)(int)(local_34 - iVar4));
        local_40 = *pvVar9;
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar5 + 0x2200),
                            (long)(int)(local_34 - iVar4));
        local_48 = *pvVar9;
      }
      if ((local_40 <= -INFINITY) && (INFINITY <= local_48)) {
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x2578),
                             (long)(int)local_34);
        log_options_ = (HighsLogOptions *)-*pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x2578),
                             (long)(int)local_34);
        *pvVar10 = 0.0;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x2560),
                             (long)(int)local_34);
        dVar1 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x2560),
                             (long)(int)local_34);
        *pvVar10 = dVar1 + (double)log_options_;
        local_28 = local_28 + 1;
        local_30 = (HighsLogOptions *)(ABS((double)log_options_) + (double)local_30);
        highsLogDev(log_options_,(HighsLogType)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),
                    (char *)0x3,"Variable %d is free: shift cost to zero dual of %g\n",
                    (ulong)local_34);
      }
    }
  }
  if (local_28 != 0) {
    highsLogDev(local_30,(HighsLogType)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),(char *)0x2
                ,"Performed %d cost shift(s) for free variables to zero dual values: total = %g\n",
                (ulong)local_28);
    *(undefined1 *)(lVar7 + 0x28d4) = 1;
  }
  return;
}

Assistant:

void HEkkDual::exitPhase1ResetDuals() {
  const HighsLp& lp = ekk_instance_.lp_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  // This use of costs_alt_perturbed is not executed by ctest
  //
  //  assert(99==2);
  if (info.costs_perturbed) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "Costs are already perturbed in exitPhase1ResetDuals\n");
  } else {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "Re-perturbing costs when optimal in phase 1\n");
    ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhase2, true);
    ekk_instance_.computeDual();
  }

  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  HighsInt num_shift = 0;
  double sum_shift = 0;
  for (HighsInt iVar = 0; iVar < numTot; iVar++) {
    if (basis.nonbasicFlag_[iVar]) {
      double lp_lower;
      double lp_upper;
      if (iVar < lp.num_col_) {
        lp_lower = lp.col_lower_[iVar];
        lp_upper = lp.col_upper_[iVar];
      } else {
        HighsInt iRow = iVar - lp.num_col_;
        lp_lower = lp.row_lower_[iRow];
        lp_upper = lp.row_upper_[iRow];
      }
      if (lp_lower <= -kHighsInf && lp_upper >= kHighsInf) {
        const double shift = -info.workDual_[iVar];
        info.workDual_[iVar] = 0;
        info.workCost_[iVar] = info.workCost_[iVar] + shift;
        num_shift++;
        sum_shift += fabs(shift);
        highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kVerbose,
                    "Variable %" HIGHSINT_FORMAT
                    " is free: shift cost to zero dual of %g\n",
                    iVar, shift);
      }
    }
  }
  if (num_shift) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "Performed %" HIGHSINT_FORMAT
                " cost shift(s) for free variables to zero "
                "dual values: total = %g\n",
                num_shift, sum_shift);
    info.costs_shifted = true;
  }
}